

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double frechet_cdf(double x,double alpha)

{
  double dVar1;
  
  if (alpha <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FRECHET_CDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  ALPHA <= 0.0.\n");
    exit(1);
  }
  if (0.0 < x) {
    dVar1 = pow(x,alpha);
    dVar1 = exp(-1.0 / dVar1);
    return dVar1;
  }
  return 0.0;
}

Assistant:

double frechet_cdf ( double x, double alpha )

//****************************************************************************80
//
//  Purpose:
//
//    FRECHET_CDF evaluates the Frechet CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 September 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double ALPHA, the parameter.
//    It is required that 0.0 < ALPHA.
//
//    Input, double X, the argument of the CDF.
//
//    Output, double CDF, the value of the CDF.
//
{
  double cdf;

  if ( alpha <= 0.0 )
  {
    cerr << "\n";
    cerr << "FRECHET_CDF - Fatal error!\n";
    cerr << "  ALPHA <= 0.0.\n";
    exit ( 1 );
  }

  if ( x <= 0.0 )
  {
    cdf = 0.0;
  }
  else
  {
    cdf = exp ( - 1.0 / pow ( x, alpha ) );
  }

  return cdf;
}